

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

size_t __thiscall MutableS2ShapeIndex::SpaceUsed(MutableS2ShapeIndex *this)

{
  pointer puVar1;
  pointer puVar2;
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *pvVar3;
  atomic<const_S2ShapeIndexCell_*> this_00;
  uint uVar4;
  size_type sVar5;
  const_reference pvVar6;
  long lVar7;
  uint uVar8;
  int s;
  uint uVar9;
  size_t sVar10;
  Iterator it;
  
  puVar1 = (this->shapes_).
           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar2 = (this->shapes_).
           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::bytes_used((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                        *)&this->cell_map_);
  it.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  it.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  it.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_00304188;
  it.index_ = (MutableS2ShapeIndex *)0x0;
  it.iter_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  it.iter_.position = -1;
  it.end_.node = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                  *)0x0;
  sVar10 = (long)puVar1 +
           (this->cell_map_).
           super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .
           super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .
           super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .tree_.size_ * 0x10 + (sVar5 - (long)puVar2) + 0x40;
  it.end_.position = -1;
  Iterator::InitStale(&it,this,BEGIN);
  while (this_00._M_b._M_p = it.super_IteratorBase.cell_._M_b._M_p,
        it.super_IteratorBase.id_.id_ != 0xffffffffffffffff) {
    uVar4 = *(uint *)it.super_IteratorBase.cell_._M_b._M_p;
    uVar8 = uVar4 >> 0x18 & 0x3f;
    uVar9 = 1 << ((byte)uVar8 & 0x1f);
    if ((uVar4 >> 0x1e & 1) == 0) {
      uVar9 = uVar8;
    }
    sVar10 = sVar10 + (ulong)uVar9 * 0x10;
    for (uVar9 = 0; uVar9 < (uVar4 & 0xffffff); uVar9 = uVar9 + 1) {
      pvVar6 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                         ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                          this_00._M_b._M_p,uVar9);
      lVar7 = 0;
      if (5 < *(uint *)&pvVar6->field_0x4) {
        lVar7 = (ulong)(*(uint *)&pvVar6->field_0x4 >> 1) << 2;
      }
      sVar10 = sVar10 + lVar7;
      uVar4 = *(uint *)this_00._M_b._M_p;
    }
    Iterator::Next(&it);
  }
  pvVar3 = (this->pending_removals_)._M_t.
           super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           .
           super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
           ._M_head_impl;
  if (pvVar3 != (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                 *)0x0) {
    sVar10 = (long)*(pointer *)
                    ((long)&(pvVar3->
                            super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                            )._M_impl + 0x10) +
             (sVar10 - *(long *)&(pvVar3->
                                 super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                                 )._M_impl);
  }
  return sVar10;
}

Assistant:

size_t MutableS2ShapeIndex::SpaceUsed() const {
  size_t size = sizeof(*this);
  size += shapes_.capacity() * sizeof(std::unique_ptr<S2Shape>);
  // cell_map_ itself is already included in sizeof(*this).
  size += cell_map_.bytes_used() - sizeof(cell_map_);
  size += cell_map_.size() * sizeof(S2ShapeIndexCell);
  Iterator it;
  for (it.InitStale(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    const S2ShapeIndexCell& cell = it.cell();
    size += cell.shapes_.capacity() * sizeof(S2ClippedShape);
    for (int s = 0; s < cell.num_clipped(); ++s) {
      const S2ClippedShape& clipped = cell.clipped(s);
      if (!clipped.is_inline()) {
        size += clipped.num_edges() * sizeof(int32);
      }
    }
  }
  if (pending_removals_ != nullptr) {
    size += pending_removals_->capacity() * sizeof(RemovedShape);
  }

  return size;
}